

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::allInstruction
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this)

{
  ulong *puVar1;
  int iVar2;
  pointer ppAVar3;
  long lVar4;
  pointer ppRVar5;
  pointer ppBVar6;
  pointer ppBVar7;
  pointer ppTVar8;
  pointer ppIVar9;
  Molecule *pMVar10;
  ulong uVar11;
  Atom *pAVar12;
  ulong uVar13;
  RigidBody *pRVar14;
  Bond *pBVar15;
  Bend *pBVar16;
  Torsion *pTVar17;
  Inversion *pIVar18;
  pointer ppAVar19;
  pointer ppRVar20;
  pointer ppBVar21;
  pointer ppBVar22;
  pointer ppTVar23;
  pointer ppIVar24;
  MoleculeIterator mi;
  MoleculeIterator local_28;
  
  createSelectionSets(__return_storage_ptr__,this);
  local_28._M_node = (_Base_ptr)0x0;
  pMVar10 = SimInfo::beginMolecule(this->info,&local_28);
  while (pMVar10 != (Molecule *)0x0) {
    ppAVar19 = (pMVar10->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppAVar3 = (pMVar10->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppAVar19 == ppAVar3) {
      pAVar12 = (Atom *)0x0;
    }
    else {
      pAVar12 = *ppAVar19;
    }
    if (pAVar12 != (Atom *)0x0) {
      lVar4 = *(long *)&(((__return_storage_ptr__->bitsets_).
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                        super__Bvector_base<std::allocator<bool>_>;
      do {
        ppAVar19 = ppAVar19 + 1;
        iVar2 = (pAVar12->super_StuntDouble).globalIndex_;
        uVar13 = (ulong)iVar2;
        uVar11 = uVar13 + 0x3f;
        if (-1 < (long)uVar13) {
          uVar11 = uVar13;
        }
        puVar1 = (ulong *)(lVar4 + ((long)uVar11 >> 6) * 8 + -8 +
                          (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        if (ppAVar19 == ppAVar3) {
          pAVar12 = (Atom *)0x0;
        }
        else {
          pAVar12 = *ppAVar19;
        }
      } while (pAVar12 != (Atom *)0x0);
    }
    ppRVar20 = (pMVar10->rigidBodies_).
               super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppRVar5 = (pMVar10->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppRVar20 == ppRVar5) {
      pRVar14 = (RigidBody *)0x0;
    }
    else {
      pRVar14 = *ppRVar20;
    }
    if (pRVar14 != (RigidBody *)0x0) {
      lVar4 = *(long *)&(((__return_storage_ptr__->bitsets_).
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                        super__Bvector_base<std::allocator<bool>_>;
      do {
        ppRVar20 = ppRVar20 + 1;
        iVar2 = (pRVar14->super_StuntDouble).globalIndex_;
        uVar13 = (ulong)iVar2;
        uVar11 = uVar13 + 0x3f;
        if (-1 < (long)uVar13) {
          uVar11 = uVar13;
        }
        puVar1 = (ulong *)(lVar4 + ((long)uVar11 >> 6) * 8 + -8 +
                          (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        if (ppRVar20 == ppRVar5) {
          pRVar14 = (RigidBody *)0x0;
        }
        else {
          pRVar14 = *ppRVar20;
        }
      } while (pRVar14 != (RigidBody *)0x0);
    }
    ppBVar21 = (pMVar10->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppBVar6 = (pMVar10->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppBVar21 == ppBVar6) {
      pBVar15 = (Bond *)0x0;
    }
    else {
      pBVar15 = *ppBVar21;
    }
    if (pBVar15 != (Bond *)0x0) {
      lVar4 = *(long *)&(__return_storage_ptr__->bitsets_).
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].bitset_.
                        super__Bvector_base<std::allocator<bool>_>;
      do {
        ppBVar21 = ppBVar21 + 1;
        iVar2 = (pBVar15->super_ShortRangeInteraction).globalIndex_;
        uVar13 = (ulong)iVar2;
        uVar11 = uVar13 + 0x3f;
        if (-1 < (long)uVar13) {
          uVar11 = uVar13;
        }
        puVar1 = (ulong *)(lVar4 + ((long)uVar11 >> 6) * 8 + -8 +
                          (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        if (ppBVar21 == ppBVar6) {
          pBVar15 = (Bond *)0x0;
        }
        else {
          pBVar15 = *ppBVar21;
        }
      } while (pBVar15 != (Bond *)0x0);
    }
    ppBVar22 = (pMVar10->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppBVar7 = (pMVar10->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppBVar22 == ppBVar7) {
      pBVar16 = (Bend *)0x0;
    }
    else {
      pBVar16 = *ppBVar22;
    }
    if (pBVar16 != (Bend *)0x0) {
      lVar4 = *(long *)&(__return_storage_ptr__->bitsets_).
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].bitset_.
                        super__Bvector_base<std::allocator<bool>_>;
      do {
        ppBVar22 = ppBVar22 + 1;
        iVar2 = (pBVar16->super_ShortRangeInteraction).globalIndex_;
        uVar13 = (ulong)iVar2;
        uVar11 = uVar13 + 0x3f;
        if (-1 < (long)uVar13) {
          uVar11 = uVar13;
        }
        puVar1 = (ulong *)(lVar4 + ((long)uVar11 >> 6) * 8 + -8 +
                          (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        if (ppBVar22 == ppBVar7) {
          pBVar16 = (Bend *)0x0;
        }
        else {
          pBVar16 = *ppBVar22;
        }
      } while (pBVar16 != (Bend *)0x0);
    }
    ppTVar23 = (pMVar10->torsions_).
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppTVar8 = (pMVar10->torsions_).
              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppTVar23 == ppTVar8) {
      pTVar17 = (Torsion *)0x0;
    }
    else {
      pTVar17 = *ppTVar23;
    }
    if (pTVar17 != (Torsion *)0x0) {
      lVar4 = *(long *)&(__return_storage_ptr__->bitsets_).
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start[3].bitset_.
                        super__Bvector_base<std::allocator<bool>_>;
      do {
        ppTVar23 = ppTVar23 + 1;
        iVar2 = (pTVar17->super_ShortRangeInteraction).globalIndex_;
        uVar13 = (ulong)iVar2;
        uVar11 = uVar13 + 0x3f;
        if (-1 < (long)uVar13) {
          uVar11 = uVar13;
        }
        puVar1 = (ulong *)(lVar4 + ((long)uVar11 >> 6) * 8 + -8 +
                          (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        if (ppTVar23 == ppTVar8) {
          pTVar17 = (Torsion *)0x0;
        }
        else {
          pTVar17 = *ppTVar23;
        }
      } while (pTVar17 != (Torsion *)0x0);
    }
    ppIVar24 = (pMVar10->inversions_).
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppIVar9 = (pMVar10->inversions_).
              super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppIVar24 == ppIVar9) {
      pIVar18 = (Inversion *)0x0;
    }
    else {
      pIVar18 = *ppIVar24;
    }
    if (pIVar18 != (Inversion *)0x0) {
      lVar4 = *(long *)&(__return_storage_ptr__->bitsets_).
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start[4].bitset_.
                        super__Bvector_base<std::allocator<bool>_>;
      do {
        ppIVar24 = ppIVar24 + 1;
        iVar2 = (pIVar18->super_ShortRangeInteraction).globalIndex_;
        uVar13 = (ulong)iVar2;
        uVar11 = uVar13 + 0x3f;
        if (-1 < (long)uVar13) {
          uVar11 = uVar13;
        }
        puVar1 = (ulong *)(lVar4 + ((long)uVar11 >> 6) * 8 + -8 +
                          (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        if (ppIVar24 == ppIVar9) {
          pIVar18 = (Inversion *)0x0;
        }
        else {
          pIVar18 = *ppIVar24;
        }
      } while (pIVar18 != (Inversion *)0x0);
    }
    uVar13 = (ulong)pMVar10->globalIndex_;
    uVar11 = uVar13 + 0x3f;
    if (-1 < (long)uVar13) {
      uVar11 = uVar13;
    }
    puVar1 = (ulong *)(((long)uVar11 >> 6) * 8 +
                       *(long *)&(__return_storage_ptr__->bitsets_).
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start[5].bitset_.
                                 super__Bvector_base<std::allocator<bool>_> + -8 +
                      (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8);
    *puVar1 = *puVar1 | 1L << ((byte)pMVar10->globalIndex_ & 0x3f);
    pMVar10 = SimInfo::nextMolecule(this->info,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::allInstruction() {
    SelectionSet ss = createSelectionSets();

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    // Doing the loop insures that we're actually on this processor.

    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        ss.bitsets_[BOND].setBitOn(bond->getGlobalIndex());
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        ss.bitsets_[BEND].setBitOn(bend->getGlobalIndex());
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        ss.bitsets_[TORSION].setBitOn(torsion->getGlobalIndex());
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        ss.bitsets_[INVERSION].setBitOn(inversion->getGlobalIndex());
      }
      ss.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());
    }

    return ss;
  }